

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

int read_markers(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  JOCTET JVar3;
  JOCTET JVar4;
  byte bVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  boolean bVar25;
  int iVar26;
  uint uVar27;
  jpeg_error_mgr *pjVar28;
  JHUFF_TBL *pJVar29;
  JQUANT_TBL *pJVar30;
  long lVar31;
  jpeg_component_info *pjVar32;
  boolean is_arith;
  ulong uVar33;
  ulong uVar34;
  UINT16 UVar35;
  uint uVar36;
  byte *pbVar37;
  JHUFF_TBL **ppJVar38;
  jpeg_component_info *pjVar39;
  boolean is_baseline;
  size_t sVar40;
  JOCTET *pJVar41;
  long lVar42;
  ulong uVar43;
  byte *pbVar44;
  jpeg_source_mgr *pjVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int *local_190;
  UINT8 bits [17];
  byte local_138 [264];
  
  uVar36 = cinfo->unread_marker;
  do {
    if (uVar36 == 0) {
      if (cinfo->marker->saw_SOI == 0) {
        pjVar45 = cinfo->src;
        sVar40 = pjVar45->bytes_in_buffer;
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        bVar1 = *pjVar45->next_input_byte;
        sVar40 = sVar40 - 1;
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          pbVar37 = pjVar45->next_input_byte;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        else {
          pbVar37 = pjVar45->next_input_byte + 1;
        }
        bVar2 = *pbVar37;
        uVar36 = (uint)bVar2;
        if (bVar2 != 0xd8 || bVar1 != 0xff) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x37;
          *(uint *)&pjVar28->msg_parm = (uint)bVar1;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar2;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->unread_marker = (uint)bVar2;
        pjVar45->next_input_byte = pbVar37 + 1;
        pjVar45->bytes_in_buffer = sVar40 - 1;
      }
      else {
        bVar25 = next_marker(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        uVar36 = cinfo->unread_marker;
      }
    }
    switch(uVar36) {
    case 0xc0:
      is_baseline = 1;
      goto LAB_00105822;
    case 0xc1:
      is_baseline = 0;
LAB_00105822:
      bVar25 = 0;
LAB_00105824:
      is_arith = 0;
      goto LAB_0010593c;
    case 0xc2:
      is_baseline = 0;
      bVar25 = 1;
      goto LAB_00105824;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x3e;
      goto LAB_00105746;
    case 0xc4:
      pjVar45 = cinfo->src;
      sVar40 = pjVar45->bytes_in_buffer;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      bVar1 = *pjVar45->next_input_byte;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pbVar44 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pbVar44 = pjVar45->next_input_byte + 1;
      }
      sVar40 = sVar40 - 1;
      pbVar37 = pbVar44 + 1;
      for (lVar31 = (ulong)*pbVar44 + (ulong)bVar1 * 0x100 + -2; 0x10 < lVar31;
          lVar31 = (lVar31 + -0x11) - uVar46) {
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          pbVar37 = pjVar45->next_input_byte;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        bVar1 = *pbVar37;
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x52;
        *(uint *)&pjVar28->msg_parm = (uint)bVar1;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        bits[0] = '\0';
        uVar36 = 0;
        lVar42 = 1;
        while( true ) {
          pbVar37 = pbVar37 + 1;
          sVar40 = sVar40 - 1;
          if (lVar42 == 0x11) break;
          if (sVar40 == 0) {
            bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00106441;
            pbVar37 = pjVar45->next_input_byte;
            sVar40 = pjVar45->bytes_in_buffer;
          }
          bVar2 = *pbVar37;
          bits[lVar42] = bVar2;
          uVar36 = uVar36 + bVar2;
          lVar42 = lVar42 + 1;
        }
        pjVar28 = cinfo->err;
        auVar11[0xc] = SUB41(bits._1_4_,3);
        auVar11._0_12_ = ZEXT712(0);
        auVar23[1] = 0;
        auVar23[0] = SUB41(bits._1_4_,2);
        auVar23._2_3_ = auVar11._10_3_;
        auVar23._5_8_ = 0;
        auVar48[5] = 0;
        auVar48[4] = SUB41(bits._1_4_,1);
        auVar48._6_7_ = SUB137(auVar23 << 0x40,6);
        auVar48._0_4_ = bits._1_4_ & 0xff;
        auVar48._13_3_ = 0;
        *(undefined1 (*) [16])&pjVar28->msg_parm = auVar48;
        uVar46 = (ulong)(ushort)bits._5_4_ & 0xffffffffffff00ff;
        auVar12._8_4_ = 0;
        auVar12._0_8_ = uVar46;
        auVar12[0xc] = SUB41(bits._5_4_,3);
        auVar13[8] = SUB41(bits._5_4_,2);
        auVar13._0_8_ = uVar46;
        auVar13[9] = 0;
        auVar13._10_3_ = auVar12._10_3_;
        auVar19._5_8_ = 0;
        auVar19._0_5_ = auVar13._8_5_;
        auVar49._0_4_ = (undefined4)uVar46;
        auVar14[4] = SUB41(bits._5_4_,1);
        auVar14._0_4_ = auVar49._0_4_;
        auVar14[5] = 0;
        auVar14._6_7_ = SUB137(auVar19 << 0x40,6);
        auVar49._4_9_ = auVar14._4_9_;
        auVar49._13_3_ = 0;
        *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar49;
        pjVar28->msg_code = 0x58;
        (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
        pjVar28 = cinfo->err;
        auVar15[0xc] = SUB41(bits._9_4_,3);
        auVar15._0_12_ = ZEXT712(0);
        auVar24[1] = 0;
        auVar24[0] = SUB41(bits._9_4_,2);
        auVar24._2_3_ = auVar15._10_3_;
        auVar24._5_8_ = 0;
        auVar50[5] = 0;
        auVar50[4] = SUB41(bits._9_4_,1);
        auVar50._6_7_ = SUB137(auVar24 << 0x40,6);
        auVar50._0_4_ = bits._9_4_ & 0xff;
        auVar50._13_3_ = 0;
        *(undefined1 (*) [16])&pjVar28->msg_parm = auVar50;
        uVar46 = (ulong)(ushort)bits._13_4_ & 0xffffffffffff00ff;
        auVar16._8_4_ = 0;
        auVar16._0_8_ = uVar46;
        auVar16[0xc] = SUB41(bits._13_4_,3);
        auVar17[8] = SUB41(bits._13_4_,2);
        auVar17._0_8_ = uVar46;
        auVar17[9] = 0;
        auVar17._10_3_ = auVar16._10_3_;
        auVar20._5_8_ = 0;
        auVar20._0_5_ = auVar17._8_5_;
        auVar51._0_4_ = (undefined4)uVar46;
        auVar18[4] = SUB41(bits._13_4_,1);
        auVar18._0_4_ = auVar51._0_4_;
        auVar18[5] = 0;
        auVar18._6_7_ = SUB137(auVar20 << 0x40,6);
        auVar51._4_9_ = auVar18._4_9_;
        auVar51._13_3_ = 0;
        *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar51;
        pjVar28->msg_code = 0x58;
        (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
        uVar46 = (ulong)uVar36;
        if ((0x100 < uVar36) || (lVar31 + -0x11 < (long)uVar46)) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 9;
          (*pjVar28->error_exit)((j_common_ptr)cinfo);
        }
        for (uVar33 = 0; uVar46 != uVar33; uVar33 = uVar33 + 1) {
          if (sVar40 == 0) {
            bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_00106441;
            pbVar37 = pjVar45->next_input_byte;
            sVar40 = pjVar45->bytes_in_buffer;
          }
          sVar40 = sVar40 - 1;
          bVar2 = *pbVar37;
          pbVar37 = pbVar37 + 1;
          local_138[uVar33] = bVar2;
        }
        uVar27 = bVar1 - 0x10;
        bVar47 = (bVar1 & 0x10) == 0;
        uVar36 = uVar27;
        if (bVar47) {
          uVar36 = (uint)bVar1;
        }
        ppJVar38 = cinfo->dc_huff_tbl_ptrs + bVar1;
        if (!bVar47) {
          ppJVar38 = cinfo->ac_huff_tbl_ptrs + uVar27;
        }
        if (3 < (int)uVar36) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x1f;
          (pjVar28->msg_parm).i[0] = uVar36;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        pJVar29 = *ppJVar38;
        if (pJVar29 == (JHUFF_TBL *)0x0) {
          pJVar29 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
          *ppJVar38 = pJVar29;
        }
        pJVar29->bits[0x10] = bits[0x10];
        *(ulong *)pJVar29->bits = CONCAT35(bits._5_3_,CONCAT41(bits._1_4_,bits[0]));
        *(ulong *)(pJVar29->bits + 8) = CONCAT35(bits._13_3_,CONCAT41(bits._9_4_,bits[8]));
        memcpy((*ppJVar38)->huffval,local_138,0x100);
      }
      if (lVar31 != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xc;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      goto LAB_001060a3;
    case 0xc9:
      is_baseline = 0;
      bVar25 = 0;
      is_arith = 1;
      goto LAB_0010593c;
    case 0xca:
      is_baseline = 0;
      is_arith = 1;
      bVar25 = 1;
LAB_0010593c:
      bVar25 = get_sof(cinfo,is_baseline,bVar25,is_arith);
      if (bVar25 == 0) {
        return 0;
      }
      break;
    case 0xcc:
      pjVar45 = cinfo->src;
      sVar40 = pjVar45->bytes_in_buffer;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      JVar3 = *pjVar45->next_input_byte;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pbVar37 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pbVar37 = pjVar45->next_input_byte + 1;
      }
      uVar46 = (ulong)CONCAT11(JVar3,*pbVar37);
      while( true ) {
        pbVar37 = pbVar37 + 1;
        sVar40 = sVar40 - 1;
        if (uVar46 < 3) break;
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          pbVar37 = pjVar45->next_input_byte;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        bVar1 = *pbVar37;
        sVar40 = sVar40 - 1;
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          pbVar37 = pjVar45->next_input_byte;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        else {
          pbVar37 = pbVar37 + 1;
        }
        bVar2 = *pbVar37;
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x51;
        uVar36 = (uint)bVar1;
        (pjVar28->msg_parm).i[0] = uVar36;
        (cinfo->err->msg_parm).i[1] = (uint)bVar2;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        if (bVar1 < 0x20) {
          if (0xf < bVar1) goto LAB_00105fbf;
          cinfo->arith_dc_L[uVar36] = bVar2 & 0xf;
          cinfo->arith_dc_U[uVar36] = bVar2 >> 4;
          if (bVar2 >> 4 < (bVar2 & 0xf)) {
            pjVar28 = cinfo->err;
            pjVar28->msg_code = 0x1e;
            (pjVar28->msg_parm).i[0] = (uint)bVar2;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
        }
        else {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x1d;
          (pjVar28->msg_parm).i[0] = (uint)bVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00105fbf:
          cinfo->arith_ac_K[bVar1 - 0x10] = bVar2;
        }
        uVar46 = uVar46 - 2;
      }
      if (uVar46 != 2) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xc;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      pjVar45->next_input_byte = pbVar37;
      pjVar45->bytes_in_buffer = sVar40;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      goto switchD_00105716_caseD_d0;
    case 0xd8:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x68;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
      if (cinfo->marker->saw_SOI != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x3f;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      for (lVar31 = -0x10; lVar31 != 0; lVar31 = lVar31 + 1) {
        cinfo->arith_dc_U[lVar31] = '\0';
        cinfo->arith_ac_K[lVar31] = '\x01';
        cinfo->arith_ac_K[lVar31 + 0x10] = '\x05';
      }
      cinfo->restart_interval = 0;
      cinfo->saw_JFIF_marker = 0;
      cinfo->jpeg_color_space = JCS_UNKNOWN;
      cinfo->CCIR601_sampling = 0;
      cinfo->JFIF_major_version = '\x01';
      cinfo->JFIF_minor_version = '\x01';
      cinfo->density_unit = '\0';
      cinfo->X_density = 1;
      cinfo->Y_density = 1;
      cinfo->saw_Adobe_marker = 0;
      cinfo->Adobe_transform = '\0';
      cinfo->marker->saw_SOI = 1;
      break;
    case 0xd9:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x57;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
      cinfo->unread_marker = 0;
      return 2;
    case 0xda:
      pjVar45 = cinfo->src;
      pJVar41 = pjVar45->next_input_byte;
      sVar40 = pjVar45->bytes_in_buffer;
      if (cinfo->marker->saw_SOF == 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x40;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pJVar41 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      JVar3 = *pJVar41;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pJVar41 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pJVar41 = pJVar41 + 1;
      }
      JVar4 = *pJVar41;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pbVar37 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pbVar37 = pJVar41 + 1;
      }
      bVar1 = *pbVar37;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x69;
      *(uint *)&pjVar28->msg_parm = (uint)bVar1;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      if (((CONCAT11(JVar3,JVar4) != (ushort)((ushort)bVar1 * 2 + 6)) || (4 < bVar1)) ||
         (((ulong)bVar1 == 0 && (cinfo->progressive_mode == 0)))) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xc;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->comps_in_scan = (uint)bVar1;
      uVar46 = 0;
      goto LAB_00106238;
    case 0xdb:
      pjVar45 = cinfo->src;
      sVar40 = pjVar45->bytes_in_buffer;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      bVar1 = *pjVar45->next_input_byte;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pbVar37 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pbVar37 = pjVar45->next_input_byte + 1;
      }
      sVar40 = sVar40 - 1;
      pbVar44 = pbVar37 + 1;
      for (uVar46 = ((ulong)bVar1 * 0x100 + (ulong)*pbVar37) - 2; 0 < (long)uVar46;
          uVar46 = uVar33 - (uVar46 + uVar34)) {
        if (sVar40 == 0) {
          bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_00106441;
          pbVar44 = pjVar45->next_input_byte;
          sVar40 = pjVar45->bytes_in_buffer;
        }
        bVar1 = *pbVar44;
        uVar36 = bVar1 & 0xf;
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x53;
        (pjVar28->msg_parm).i[0] = uVar36;
        *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar1 >> 4);
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
        if (3 < uVar36) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x20;
          (pjVar28->msg_parm).i[0] = uVar36;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        pJVar30 = cinfo->quant_tbl_ptrs[uVar36];
        if (pJVar30 == (JQUANT_TBL *)0x0) {
          pJVar30 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
          cinfo->quant_tbl_ptrs[uVar36] = pJVar30;
        }
        uVar33 = uVar46 - 1;
        if (bVar1 < 0x10) {
          uVar34 = 0x40;
          local_190 = jpeg_natural_order;
          if (uVar46 < 0x41) {
            for (lVar31 = 0; uVar34 = uVar33, lVar31 != 0x40; lVar31 = lVar31 + 1) {
              pJVar30->quantval[lVar31] = 1;
            }
LAB_00105d49:
            if (uVar34 == 4) {
              local_190 = jpeg_natural_order2;
            }
            else if (uVar34 == 0x31) {
              local_190 = jpeg_natural_order7;
            }
            else if (uVar34 == 0x10) {
              local_190 = jpeg_natural_order4;
            }
            else if (uVar34 == 0x19) {
              local_190 = jpeg_natural_order5;
            }
            else if (uVar34 == 0x24) {
              local_190 = jpeg_natural_order6;
            }
            else if (uVar34 == 9) {
              local_190 = jpeg_natural_order3;
            }
            else {
              local_190 = jpeg_natural_order;
            }
          }
        }
        else {
          uVar34 = 0x40;
          local_190 = jpeg_natural_order;
          if (uVar46 < 0x81) {
            for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
              pJVar30->quantval[lVar31] = 1;
            }
            uVar34 = uVar33 >> 1;
            goto LAB_00105d49;
          }
        }
        uVar46 = 0;
        if (0 < (long)uVar34) {
          uVar46 = uVar34;
        }
        uVar43 = 0;
        while( true ) {
          sVar40 = sVar40 - 1;
          pbVar44 = pbVar44 + 1;
          if (uVar46 == uVar43) break;
          if (bVar1 < 0x10) {
            if (sVar40 == 0) {
              bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
              if (bVar25 == 0) goto LAB_00106441;
              pbVar44 = pjVar45->next_input_byte;
              sVar40 = pjVar45->bytes_in_buffer;
            }
            UVar35 = (UINT16)*pbVar44;
          }
          else {
            if (sVar40 == 0) {
              bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
              if (bVar25 == 0) goto LAB_00106441;
              pbVar44 = pjVar45->next_input_byte;
              sVar40 = pjVar45->bytes_in_buffer;
            }
            bVar2 = *pbVar44;
            sVar40 = sVar40 - 1;
            if (sVar40 == 0) {
              bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
              if (bVar25 == 0) goto LAB_00106441;
              pbVar44 = pjVar45->next_input_byte;
              sVar40 = pjVar45->bytes_in_buffer;
            }
            else {
              pbVar44 = pbVar44 + 1;
            }
            UVar35 = CONCAT11(bVar2,*pbVar44);
          }
          pJVar30->quantval[local_190[uVar43]] = UVar35;
          uVar43 = uVar43 + 1;
        }
        if (1 < cinfo->err->trace_level) {
          for (uVar46 = 0; uVar46 < 0x40; uVar46 = uVar46 + 8) {
            pjVar28 = cinfo->err;
            uVar43 = *(ulong *)(pJVar30->quantval + uVar46);
            auVar7._8_4_ = 0;
            auVar7._0_8_ = uVar43;
            auVar7._12_2_ = (short)(uVar43 >> 0x30);
            auVar9._8_2_ = (short)(uVar43 >> 0x20);
            auVar9._0_8_ = uVar43;
            auVar9._10_4_ = auVar7._10_4_;
            auVar21._6_8_ = 0;
            auVar21._0_6_ = auVar9._8_6_;
            auVar52._6_8_ = SUB148(auVar21 << 0x40,6);
            auVar52._4_2_ = (short)(uVar43 >> 0x10);
            auVar52._0_2_ = (ushort)uVar43;
            auVar52._2_2_ = 0;
            auVar52._14_2_ = 0;
            *(undefined1 (*) [16])&pjVar28->msg_parm = auVar52;
            uVar43 = *(ulong *)(pJVar30->quantval + uVar46 + 4);
            auVar6._8_4_ = 0;
            auVar6._0_8_ = uVar43;
            auVar6._12_2_ = (short)(uVar43 >> 0x30);
            auVar8._8_2_ = (short)(uVar43 >> 0x20);
            auVar8._0_8_ = uVar43;
            auVar8._10_4_ = auVar6._10_4_;
            auVar22._6_8_ = 0;
            auVar22._0_6_ = auVar8._8_6_;
            auVar10._4_2_ = (short)(uVar43 >> 0x10);
            auVar10._0_4_ = (uint)uVar43;
            auVar10._6_8_ = SUB148(auVar22 << 0x40,6);
            auVar53._0_4_ = (uint)uVar43 & 0xffff;
            auVar53._4_10_ = auVar10._4_10_;
            auVar53._14_2_ = 0;
            *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar53;
            pjVar28->msg_code = 0x5f;
            (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
          }
        }
        uVar46 = uVar34;
        if (bVar1 < 0x10) {
          uVar46 = 0;
        }
      }
      if (uVar46 != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xc;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      pjVar45->next_input_byte = pbVar44;
      pjVar45->bytes_in_buffer = sVar40;
      break;
    case 0xdc:
      iVar26 = skip_variable(cinfo);
      goto LAB_0010572e;
    case 0xdd:
      pjVar45 = cinfo->src;
      sVar40 = pjVar45->bytes_in_buffer;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      JVar3 = *pjVar45->next_input_byte;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pJVar41 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pJVar41 = pjVar45->next_input_byte + 1;
      }
      if (CONCAT11(JVar3,*pJVar41) != 4) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xc;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pJVar41 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pJVar41 = pJVar41 + 1;
      }
      JVar3 = *pJVar41;
      sVar40 = sVar40 - 1;
      if (sVar40 == 0) {
        bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_00106441;
        pJVar41 = pjVar45->next_input_byte;
        sVar40 = pjVar45->bytes_in_buffer;
      }
      else {
        pJVar41 = pJVar41 + 1;
      }
      sVar40 = sVar40 - 1;
      JVar4 = *pJVar41;
      pbVar37 = pJVar41 + 1;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x54;
      (pjVar28->msg_parm).i[0] = (uint)CONCAT11(JVar3,JVar4);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->restart_interval = (uint)CONCAT11(JVar3,JVar4);
LAB_001060a3:
      pjVar45->next_input_byte = pbVar37;
      pjVar45->bytes_in_buffer = sVar40;
      break;
    case 0xde:
    case 0xdf:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
switchD_00105716_caseD_de:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x46;
LAB_00105746:
      (pjVar28->msg_parm).i[0] = uVar36;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar26 = (*(&cinfo->marker[1].read_markers)[uVar36 - 0xe0])(cinfo);
      goto LAB_0010572e;
    case 0xfe:
      iVar26 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_0010572e:
      if (iVar26 == 0) goto LAB_00106441;
      break;
    default:
      if (uVar36 != 1) goto switchD_00105716_caseD_de;
switchD_00105716_caseD_d0:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x5e;
      (pjVar28->msg_parm).i[0] = uVar36;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    cinfo->unread_marker = 0;
    uVar36 = 0;
  } while( true );
LAB_00106238:
  pbVar37 = pbVar37 + 1;
  sVar40 = sVar40 - 1;
  if (uVar46 == bVar1) goto LAB_00106339;
  if (sVar40 == 0) {
    bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
    if (bVar25 == 0) goto LAB_00106441;
    pbVar37 = pjVar45->next_input_byte;
    sVar40 = pjVar45->bytes_in_buffer;
  }
  bVar2 = *pbVar37;
  sVar40 = sVar40 - 1;
  if (sVar40 == 0) {
    bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
    if (bVar25 == 0) goto LAB_00106441;
    pbVar37 = pjVar45->next_input_byte;
    sVar40 = pjVar45->bytes_in_buffer;
  }
  else {
    pbVar37 = pbVar37 + 1;
  }
  bVar5 = *pbVar37;
  pjVar32 = cinfo->comp_info;
  uVar33 = (ulong)(uint)cinfo->num_components;
  if (cinfo->num_components < 1) {
    uVar33 = 0;
  }
  pjVar39 = pjVar32 + uVar33;
  while( true ) {
    iVar26 = (int)uVar33;
    uVar33 = (ulong)(iVar26 - 1);
    uVar36 = (uint)bVar2;
    if (iVar26 == 0) break;
    if (pjVar32->component_id == uVar36) goto LAB_001062ed;
    pjVar32 = pjVar32 + 1;
  }
  pjVar28 = cinfo->err;
  pjVar28->msg_code = 4;
  (pjVar28->msg_parm).i[0] = uVar36;
  (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  pjVar32 = pjVar39;
LAB_001062ed:
  cinfo->cur_comp_info[uVar46] = pjVar32;
  pjVar32->dc_tbl_no = (uint)(bVar5 >> 4);
  pjVar32->ac_tbl_no = bVar5 & 0xf;
  pjVar28 = cinfo->err;
  (pjVar28->msg_parm).i[0] = uVar36;
  (pjVar28->msg_parm).i[1] = pjVar32->dc_tbl_no;
  (pjVar28->msg_parm).i[2] = pjVar32->ac_tbl_no;
  pjVar28->msg_code = 0x6a;
  (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
  uVar46 = uVar46 + 1;
  goto LAB_00106238;
LAB_00106339:
  if (sVar40 == 0) {
    bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
    if (bVar25 != 0) {
      pbVar37 = pjVar45->next_input_byte;
      sVar40 = pjVar45->bytes_in_buffer;
      goto LAB_00106359;
    }
LAB_00106441:
    iVar26 = 0;
  }
  else {
LAB_00106359:
    cinfo->Ss = (uint)*pbVar37;
    sVar40 = sVar40 - 1;
    if (sVar40 == 0) {
      bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00106441;
      pbVar37 = pjVar45->next_input_byte;
      sVar40 = pjVar45->bytes_in_buffer;
    }
    else {
      pbVar37 = pbVar37 + 1;
    }
    cinfo->Se = (uint)*pbVar37;
    sVar40 = sVar40 - 1;
    if (sVar40 == 0) {
      bVar25 = (*pjVar45->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_00106441;
      pbVar37 = pjVar45->next_input_byte;
      sVar40 = pjVar45->bytes_in_buffer;
    }
    else {
      pbVar37 = pbVar37 + 1;
    }
    bVar2 = *pbVar37;
    cinfo->Ah = (uint)(bVar2 >> 4);
    cinfo->Al = bVar2 & 0xf;
    pjVar28 = cinfo->err;
    (pjVar28->msg_parm).i[0] = cinfo->Ss;
    (pjVar28->msg_parm).i[1] = cinfo->Se;
    (pjVar28->msg_parm).i[2] = cinfo->Ah;
    (pjVar28->msg_parm).i[3] = cinfo->Al;
    pjVar28->msg_code = 0x6b;
    iVar26 = 1;
    (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
    cinfo->marker->next_restart_num = 0;
    if (bVar1 != 0) {
      cinfo->input_scan_number = cinfo->input_scan_number + 1;
    }
    pjVar45->next_input_byte = pbVar37 + 1;
    pjVar45->bytes_in_buffer = sVar40 - 1;
    cinfo->unread_marker = 0;
  }
  return iVar26;
}

Assistant:

METHODDEF(int)
read_markers (j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (! cinfo->marker->saw_SOI) {
	if (! first_marker(cinfo))
	  return JPEG_SUSPENDED;
      } else {
	if (! next_marker(cinfo))
	  return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (! get_soi(cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_SOF0:		/* Baseline */
      if (! get_sof(cinfo, TRUE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF1:		/* Extended sequential, Huffman */
      if (! get_sof(cinfo, FALSE, FALSE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF2:		/* Progressive, Huffman */
      if (! get_sof(cinfo, FALSE, TRUE, FALSE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF9:		/* Extended sequential, arithmetic */
      if (! get_sof(cinfo, FALSE, FALSE, TRUE))
	return JPEG_SUSPENDED;
      break;

    case M_SOF10:		/* Progressive, arithmetic */
      if (! get_sof(cinfo, FALSE, TRUE, TRUE))
	return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:		/* Lossless, Huffman */
    case M_SOF5:		/* Differential sequential, Huffman */
    case M_SOF6:		/* Differential progressive, Huffman */
    case M_SOF7:		/* Differential lossless, Huffman */
    case M_JPG:			/* Reserved for JPEG extensions */
    case M_SOF11:		/* Lossless, arithmetic */
    case M_SOF13:		/* Differential sequential, arithmetic */
    case M_SOF14:		/* Differential progressive, arithmetic */
    case M_SOF15:		/* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (! get_sos(cinfo))
	return JPEG_SUSPENDED;
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_SOS;
    
    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0;	/* processed the marker */
      return JPEG_REACHED_EOI;
      
    case M_DAC:
      if (! get_dac(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DHT:
      if (! get_dht(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DQT:
      if (! get_dqt(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_DRI:
      if (! get_dri(cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (! (*((my_marker_ptr) cinfo->marker)->process_APPn[
		cinfo->unread_marker - (int) M_APP0]) (cinfo))
	return JPEG_SUSPENDED;
      break;
      
    case M_COM:
      if (! (*((my_marker_ptr) cinfo->marker)->process_COM) (cinfo))
	return JPEG_SUSPENDED;
      break;

    case M_RST0:		/* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:			/* Ignore DNL ... perhaps the wrong thing */
      if (! skip_variable(cinfo))
	return JPEG_SUSPENDED;
      break;

    default:			/* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}